

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

void __thiscall
testing::internal::FunctionMockerBase<mp::BasicSuffixSet<std::allocator<char>_>_&(int)>::
ClearDefaultActionsLocked
          (FunctionMockerBase<mp::BasicSuffixSet<std::allocator<char>_>_&(int)> *this)

{
  bool bVar1;
  reference ppvVar2;
  OnCallSpec<mp::BasicSuffixSet<std::allocator<char>_>_&(int)> *in_RDI;
  const_iterator it;
  UntypedOnCallSpecs specs_to_delete;
  vector<const_void_*,_std::allocator<const_void_*>_> *in_stack_ffffffffffffff98;
  vector<const_void_*,_std::allocator<const_void_*>_> *__x;
  undefined1 *this_00;
  MutexBase *in_stack_ffffffffffffffc0;
  __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
  local_38;
  MutexBase *in_stack_ffffffffffffffd0;
  vector<const_void_*,_std::allocator<const_void_*>_> local_20;
  
  this_00 = g_gmock_mutex;
  MutexBase::AssertHeld(in_stack_ffffffffffffffd0);
  __x = &local_20;
  std::vector<const_void_*,_std::allocator<const_void_*>_>::vector
            ((vector<const_void_*,_std::allocator<const_void_*>_> *)0x275733);
  std::vector<const_void_*,_std::allocator<const_void_*>_>::swap
            ((vector<const_void_*,_std::allocator<const_void_*>_> *)this_00,__x);
  MutexBase::Unlock(in_stack_ffffffffffffffc0);
  std::vector<const_void_*,_std::allocator<const_void_*>_>::begin(in_stack_ffffffffffffff98);
  __gnu_cxx::
  __normal_iterator<void_const*const*,std::vector<void_const*,std::allocator<void_const*>>>::
  __normal_iterator<void_const**>
            ((__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
              *)in_RDI,
             (__normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
              *)in_stack_ffffffffffffff98);
  while( true ) {
    std::vector<const_void_*,_std::allocator<const_void_*>_>::end(in_stack_ffffffffffffff98);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_void_**,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    ppvVar2 = __gnu_cxx::
              __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
              ::operator*(&local_38);
    in_stack_ffffffffffffff98 = (vector<const_void_*,_std::allocator<const_void_*>_> *)*ppvVar2;
    if (in_stack_ffffffffffffff98 != (vector<const_void_*,_std::allocator<const_void_*>_> *)0x0) {
      OnCallSpec<mp::BasicSuffixSet<std::allocator<char>_>_&(int)>::~OnCallSpec(in_RDI);
      operator_delete(in_stack_ffffffffffffff98,0x50);
    }
    __gnu_cxx::
    __normal_iterator<const_void_*const_*,_std::vector<const_void_*,_std::allocator<const_void_*>_>_>
    ::operator++(&local_38);
  }
  MutexBase::Lock(in_stack_ffffffffffffffd0);
  std::vector<const_void_*,_std::allocator<const_void_*>_>::~vector
            ((vector<const_void_*,_std::allocator<const_void_*>_> *)this_00);
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();

    // Deleting our default actions may trigger other mock objects to be
    // deleted, for example if an action contains a reference counted smart
    // pointer to that mock object, and that is the last reference. So if we
    // delete our actions within the context of the global mutex we may deadlock
    // when this method is called again. Instead, make a copy of the set of
    // actions to delete, clear our set within the mutex, and then delete the
    // actions outside of the mutex.
    UntypedOnCallSpecs specs_to_delete;
    untyped_on_call_specs_.swap(specs_to_delete);

    g_gmock_mutex.Unlock();
    for (UntypedOnCallSpecs::const_iterator it =
             specs_to_delete.begin();
         it != specs_to_delete.end(); ++it) {
      delete static_cast<const OnCallSpec<F>*>(*it);
    }

    // Lock the mutex again, since the caller expects it to be locked when we
    // return.
    g_gmock_mutex.Lock();
  }